

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

int lua_resume(lua_State *L,lua_State *from,int nargs)

{
  lu_byte lVar1;
  int iVar2;
  int *piVar3;
  unsigned_short uVar4;
  uint status;
  ushort uVar5;
  unsigned_short uVar6;
  char *msg;
  CallInfo *pCVar7;
  StkId level;
  uint local_3c;
  unsigned_short local_36;
  int local_34;
  
  uVar4 = L->nny;
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  local_34 = nargs;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x2f9,"int lua_resume(lua_State *, lua_State *, int)");
  }
  lVar1 = L->status;
  if (lVar1 == '\x01') {
LAB_0012ca79:
    if (from == (lua_State *)0x0) {
      L->nCcalls = 1;
    }
    else {
      uVar5 = from->nCcalls + 1;
      L->nCcalls = uVar5;
      if (0x7c < uVar5) {
        msg = "C stack overflow";
        goto LAB_0012caa5;
      }
    }
    L->nny = 0;
    if ((long)L->top - (long)L->ci->func >> 4 <= (long)(int)(nargs + (uint)(lVar1 == '\0'))) {
      __assert_fail("(((L->status == 0) ? nargs + 1 : nargs) < (L->top - L->ci->func)) && \"not enough elements in the stack\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x305,"int lua_resume(lua_State *, lua_State *, int)");
    }
    status = luaD_rawrunprotected(L,resume,&local_34);
    while (local_3c = status, 1 < (int)status) {
      pCVar7 = L->ci;
      if (pCVar7 == (CallInfo *)0x0) {
LAB_0012cc1b:
        L->status = (lu_byte)status;
        luaD_seterrorobj(L,status,L->top);
        L->ci->top = L->top;
        goto LAB_0012cbcc;
      }
      while ((pCVar7->callstatus & 0x10) == 0) {
        pCVar7 = pCVar7->previous;
        if (pCVar7 == (CallInfo *)0x0) {
          if ((int)status < 2) goto LAB_0012cbc0;
          goto LAB_0012cc1b;
        }
      }
      level = (StkId)((long)&L->stack->value_ + pCVar7->extra);
      local_36 = uVar4;
      luaF_close(L,level,status);
      uVar4 = local_36;
      luaD_seterrorobj(L,status,level);
      L->ci = pCVar7;
      L->allowhook = (byte)pCVar7->callstatus & 1;
      L->nny = 0;
      luaD_shrinkstack(L);
      L->errfunc = (ptrdiff_t)(pCVar7->u).l.savedpc;
      status = luaD_rawrunprotected(L,unroll,&local_3c);
    }
LAB_0012cbc0:
    if (status != L->status) {
      __assert_fail("status == L->status",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x30d,"int lua_resume(lua_State *, lua_State *, int)");
    }
LAB_0012cbcc:
    L->nny = uVar4;
    uVar4 = L->nCcalls - 1;
    L->nCcalls = uVar4;
    if (from == (lua_State *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = from->nCcalls;
    }
    if (uVar6 != uVar4) {
      __assert_fail("L->nCcalls == ((from) ? from->nCcalls : 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x315,"int lua_resume(lua_State *, lua_State *, int)");
    }
    piVar3 = *(int **)&L[-1].hookmask;
    *piVar3 = *piVar3 + -1;
    if (*piVar3 != 0) {
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x316,"int lua_resume(lua_State *, lua_State *, int)");
    }
  }
  else {
    if (lVar1 == '\0') {
      if (L->ci == &L->base_ci) goto LAB_0012ca79;
      msg = "cannot resume non-suspended coroutine";
    }
    else {
      msg = "cannot resume dead coroutine";
    }
LAB_0012caa5:
    resume_error(L,msg,nargs);
    local_3c = 2;
  }
  return local_3c;
}

Assistant:

LUA_API int lua_resume (lua_State *L, lua_State *from, int nargs) {
  int status;
  unsigned short oldnny = L->nny;  /* save "number of non-yieldable" calls */
  lua_lock(L);
  if (L->status == LUA_OK) {  /* may be starting a coroutine */
    if (L->ci != &L->base_ci)  /* not in base level? */
      return resume_error(L, "cannot resume non-suspended coroutine", nargs);
  }
  else if (L->status != LUA_YIELD)
    return resume_error(L, "cannot resume dead coroutine", nargs);
  L->nCcalls = (from) ? from->nCcalls + 1 : 1;
  if (L->nCcalls >= LUAI_MAXCCALLS)
    return resume_error(L, "C stack overflow", nargs);
  luai_userstateresume(L, nargs);
  L->nny = 0;  /* allow yields */
  api_checknelems(L, (L->status == LUA_OK) ? nargs + 1 : nargs);
  status = luaD_rawrunprotected(L, resume, &nargs);
   /* continue running after recoverable errors */
  while (errorstatus(status) && recover(L, status)) {
    /* unroll continuation */
    status = luaD_rawrunprotected(L, unroll, &status);
  }
  if (likely(!errorstatus(status)))
    lua_assert(status == L->status);  /* normal end or yield */
  else {  /* unrecoverable error */
    L->status = cast_byte(status);  /* mark thread as 'dead' */
    luaD_seterrorobj(L, status, L->top);  /* push error message */
    L->ci->top = L->top;
  }
  L->nny = oldnny;  /* restore 'nny' */
  L->nCcalls--;
  lua_assert(L->nCcalls == ((from) ? from->nCcalls : 0));
  lua_unlock(L);
  return status;
}